

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void correctstack(lua_State *L)

{
  UpVal *local_20;
  UpVal *up;
  CallInfo *ci;
  lua_State *L_local;
  
  (L->top).p = (StkId)((long)(L->stack).p + (long)(L->top).p);
  (L->tbclist).p = (StkId)((long)(L->stack).p + (long)(L->tbclist).p);
  for (local_20 = L->openupval; local_20 != (UpVal *)0x0; local_20 = (local_20->u).open.next) {
    (local_20->v).p = (TValue *)((long)(L->stack).p + (long)(local_20->v).p);
  }
  for (up = (UpVal *)L->ci; up != (UpVal *)0x0; up = (UpVal *)(up->v).p) {
    *(long *)&up->tt = (long)(L->stack).p + *(long *)&up->tt;
    up->next = (GCObject *)((long)(L->stack).p + (long)up->next);
    if ((up[1].v.offset & 0x2000000000000U) == 0) {
      *(undefined4 *)&up[1].next = 1;
    }
  }
  return;
}

Assistant:

static void correctstack (lua_State *L) {
  CallInfo *ci;
  UpVal *up;
  L->top.p = restorestack(L, L->top.offset);
  L->tbclist.p = restorestack(L, L->tbclist.offset);
  for (up = L->openupval; up != NULL; up = up->u.open.next)
    up->v.p = s2v(restorestack(L, up->v.offset));
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    ci->top.p = restorestack(L, ci->top.offset);
    ci->func.p = restorestack(L, ci->func.offset);
    if (isLua(ci))
      ci->u.l.trap = 1;  /* signal to update 'trap' in 'luaV_execute' */
  }
}